

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

string * helics::stateString_abi_cxx11_(ConnectionState state)

{
  int iVar1;
  undefined1 in_DIL;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  string *local_8;
  
  if ((stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::
                                   connected_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_DIL,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff6);
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_)
     , iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_DIL,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::
                                   operating_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_DIL,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe2);
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::
                                   estate_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_DIL,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe1);
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_DIL,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe0);
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_);
  }
  switch(in_DIL) {
  case 0:
    local_8 = &stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_;
    break;
  case 1:
    local_8 = &stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_;
    break;
  case 2:
    local_8 = &stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_;
    break;
  case 0x28:
  default:
    local_8 = &stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_;
    break;
  case 0x30:
  case 0x32:
    local_8 = &stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_;
  }
  return local_8;
}

Assistant:

static const std::string& stateString(ConnectionState state)
{
    static const std::string connected{"connected"};
    static const std::string init{"init_requested"};
    static const std::string operating{"operating"};
    static const std::string estate{"error"};
    static const std::string dis{"disconnected"};
    switch (state) {
        case ConnectionState::OPERATING:
            return operating;
        case ConnectionState::INIT_REQUESTED:
            return init;
        case ConnectionState::CONNECTED:
            return connected;
        case ConnectionState::REQUEST_DISCONNECT:
        case ConnectionState::DISCONNECTED:
            return dis;
        case ConnectionState::ERROR_STATE:
        default:
            return estate;
    }
}